

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int DisconnectRPLIDAR(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uchar reqbuf [2];
  timespec req;
  undefined2 local_2e;
  undefined4 local_2c;
  timespec local_28;
  
  local_2e = 0x25a5;
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pRPLIDAR->RS232Port).s;
    uVar6 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_2e + uVar6),(ulong)(2 - (int)uVar6),0);
      if ((int)sVar2 < 1) goto LAB_00124c55;
      uVar4 = (int)uVar6 + (int)sVar2;
      uVar6 = (ulong)uVar4;
    } while ((int)uVar4 < 2);
  }
  else {
    if (iVar1 != 0) {
LAB_00124c55:
      puts("Error writing data to a RPLIDAR. ");
      puts("Error while disconnecting a RPLIDAR.");
      local_2e = 0xf0a5;
      local_2c = 0x57000002;
      iVar1 = (pRPLIDAR->RS232Port).DevType;
      if (iVar1 - 1U < 4) {
        iVar1 = (pRPLIDAR->RS232Port).s;
        uVar6 = 0;
        do {
          sVar2 = send(iVar1,(void *)((long)&local_2e + uVar6),(ulong)(6 - (int)uVar6),0);
          if ((int)sVar2 < 1) goto LAB_00124d09;
          uVar4 = (int)uVar6 + (int)sVar2;
          uVar6 = (ulong)uVar4;
        } while ((int)uVar4 < 6);
      }
      else {
        if (iVar1 != 0) {
LAB_00124d09:
          puts("Error writing data to a RPLIDAR. ");
          goto LAB_00124d15;
        }
        iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
        uVar6 = 0;
        do {
          sVar2 = write(iVar1,(void *)((long)&local_2e + uVar6),(ulong)(6 - (int)uVar6));
          if ((int)sVar2 < 1) goto LAB_00124d09;
          uVar4 = (int)uVar6 + (int)sVar2;
          uVar6 = (ulong)uVar4;
        } while (uVar4 < 6);
      }
      local_28.tv_sec = 0;
      local_28.tv_nsec = 500000000;
      nanosleep(&local_28,(timespec *)0x0);
LAB_00124d15:
      CloseRS232Port(&pRPLIDAR->RS232Port);
      return 1;
    }
    iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    lVar7 = 0;
    do {
      iVar5 = (int)lVar7;
      sVar2 = write(iVar1,(void *)((long)&local_2e + lVar7),(ulong)(2 - iVar5));
      if ((int)sVar2 < 1) goto LAB_00124c55;
      lVar7 = 1;
    } while ((uint)(iVar5 + (int)sVar2) < 2);
  }
  local_28.tv_sec = (__time_t)(pRPLIDAR->motordelay / 1000);
  local_28.tv_nsec = (long)((pRPLIDAR->motordelay % 1000) * 1000000);
  uVar6 = 0;
  nanosleep(&local_28,(timespec *)0x0);
  local_2e = 0xf0a5;
  local_2c = 0x57000002;
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pRPLIDAR->RS232Port).s;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_2e + uVar6),(ulong)(6 - (int)uVar6),0);
      if ((int)sVar2 < 1) goto LAB_00124d71;
      uVar4 = (int)uVar6 + (int)sVar2;
      uVar6 = (ulong)uVar4;
    } while ((int)uVar4 < 6);
  }
  else {
    if (iVar1 != 0) {
LAB_00124d71:
      puts("Error writing data to a RPLIDAR. ");
      goto LAB_00124d7d;
    }
    iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar6 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&local_2e + uVar6),(ulong)(6 - (int)uVar6));
      if ((int)sVar2 < 1) goto LAB_00124d71;
      uVar4 = (int)uVar6 + (int)sVar2;
      uVar6 = (ulong)uVar4;
    } while (uVar4 < 6);
  }
  local_28.tv_sec = 0;
  local_28.tv_nsec = 500000000;
  nanosleep(&local_28,(timespec *)0x0);
LAB_00124d7d:
  iVar1 = CloseRS232Port(&pRPLIDAR->RS232Port);
  if (iVar1 != 0) {
    puts("RPLIDAR disconnection failed.");
    return 1;
  }
  pcVar3 = " ";
  if (pRPLIDAR->SerialNumber[0] == '\0') {
    pcVar3 = "";
  }
  printf("RPLIDAR %.32s%.1sdisconnected.\n",pRPLIDAR->SerialNumber,pcVar3);
  return 0;
}

Assistant:

inline int DisconnectRPLIDAR(RPLIDAR* pRPLIDAR)
{
	if (StopRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
	{
		printf("Error while disconnecting a RPLIDAR.\n");
		SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
		delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
		pRPLIDAR->drv->stopMotor();
		pRPLIDAR->drv->disconnect();
		RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
		//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
		pRPLIDAR->drv->disconnect();
		delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
		CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
		return EXIT_FAILURE;
	}

	SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
	pRPLIDAR->drv->stopMotor();
	pRPLIDAR->drv->disconnect();
	RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
	//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
	pRPLIDAR->drv->disconnect();
	delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
	delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
	if (CloseRS232Port(&pRPLIDAR->RS232Port) != EXIT_SUCCESS)
	{
		printf("RPLIDAR disconnection failed.\n");
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	printf("RPLIDAR %.32s%.1sdisconnected.\n", pRPLIDAR->SerialNumber, (pRPLIDAR->SerialNumber[0])? " ": "\0");

	return EXIT_SUCCESS;
}